

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O2

void __thiscall OpenMD::DataStorage::reserve(DataStorage *this,size_t size)

{
  uint uVar1;
  
  uVar1 = this->storageLayout_;
  if ((uVar1 & 1) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->position,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 2) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->velocity,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 4) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->force,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 8) != 0) {
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    reserve(&this->aMat,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x10) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->angularMomentum,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x20) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->torque,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 & 0x40) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->particlePot,size);
    uVar1 = this->storageLayout_;
  }
  if ((char)uVar1 < '\0') {
    std::vector<double,_std::allocator<double>_>::reserve(&this->density,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->functional,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->functionalDerivative,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->dipole,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    reserve(&this->quadrupole,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->electricField,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->skippedCharge,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->flucQPos,size);
    uVar1 = this->storageLayout_;
  }
  if ((short)uVar1 < 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->flucQVel,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->flucQFrc,size);
    uVar1 = this->storageLayout_;
  }
  if ((uVar1 >> 0x11 & 1) == 0) {
    return;
  }
  std::vector<double,_std::allocator<double>_>::reserve(&this->sitePotential,size);
  return;
}

Assistant:

void DataStorage::reserve(std::size_t size) {
    if (storageLayout_ & dslPosition) { position.reserve(size); }

    if (storageLayout_ & dslVelocity) { velocity.reserve(size); }

    if (storageLayout_ & dslForce) { force.reserve(size); }

    if (storageLayout_ & dslAmat) { aMat.reserve(size); }

    if (storageLayout_ & dslAngularMomentum) { angularMomentum.reserve(size); }

    if (storageLayout_ & dslTorque) { torque.reserve(size); }

    if (storageLayout_ & dslParticlePot) { particlePot.reserve(size); }

    if (storageLayout_ & dslDensity) { density.reserve(size); }

    if (storageLayout_ & dslFunctional) { functional.reserve(size); }

    if (storageLayout_ & dslFunctionalDerivative) {
      functionalDerivative.reserve(size);
    }

    if (storageLayout_ & dslDipole) { dipole.reserve(size); }

    if (storageLayout_ & dslQuadrupole) { quadrupole.reserve(size); }

    if (storageLayout_ & dslElectricField) { electricField.reserve(size); }

    if (storageLayout_ & dslSkippedCharge) { skippedCharge.reserve(size); }

    if (storageLayout_ & dslFlucQPosition) { flucQPos.reserve(size); }

    if (storageLayout_ & dslFlucQVelocity) { flucQVel.reserve(size); }

    if (storageLayout_ & dslFlucQForce) { flucQFrc.reserve(size); }

    if (storageLayout_ & dslSitePotential) { sitePotential.reserve(size); }
  }